

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

optional<pbrt::LightBounds> * __thiscall
pbrt::DiffuseAreaLight::Bounds
          (optional<pbrt::LightBounds> *__return_storage_ptr__,DiffuseAreaLight *this)

{
  undefined8 uVar1;
  bool bVar2;
  float fVar3;
  short sVar4;
  undefined1 auVar5 [12];
  float *pfVar6;
  Tuple2<pbrt::Point2,_int> TVar7;
  float *pfVar8;
  long lVar9;
  float *pfVar10;
  int c;
  int c_00;
  Curve *this_00;
  ulong uVar11;
  Float FVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 local_88 [12];
  Float FStack_7c;
  bool local_78;
  optional<pbrt::LightBounds> *local_70;
  long local_68;
  Bounds3f local_60;
  Tuple3<pbrt::Point3,_float> local_48 [2];
  
  if (((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x < 1) ||
     ((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1)) {
    pfVar10 = (this->Lemit).values.ptr;
    uVar11 = (this->Lemit).values.nStored;
    if (1 < uVar11) {
      lVar9 = uVar11 * 4 + -4;
      pfVar8 = pfVar10;
      do {
        pfVar8 = pfVar8 + 1;
        pfVar6 = pfVar8;
        if (*pfVar8 <= *pfVar10) {
          pfVar6 = pfVar10;
        }
        pfVar10 = pfVar6;
        lVar9 = lVar9 + -4;
      } while (lVar9 != 0);
    }
    fVar13 = *pfVar10;
  }
  else {
    TVar7 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
    if (TVar7.y < 1) {
      fVar13 = 0.0;
    }
    else {
      fVar13 = 0.0;
      lVar9 = 0;
      local_70 = __return_storage_ptr__;
      do {
        local_68 = lVar9;
        if (0 < (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x) {
          uVar11 = 0;
          do {
            c_00 = 0;
            do {
              FVar12 = Image::GetChannel(&this->image,(Point2i)(lVar9 << 0x20 | uVar11),c_00,
                                         (WrapMode2D)0x200000002);
              fVar13 = fVar13 + FVar12;
              c_00 = c_00 + 1;
            } while (c_00 != 3);
            uVar11 = uVar11 + 1;
          } while ((long)uVar11 < (long)(this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x);
        }
        lVar9 = local_68 + 1;
        TVar7 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
        __return_storage_ptr__ = local_70;
      } while (lVar9 < (long)TVar7 >> 0x20);
    }
    fVar13 = fVar13 / (float)(TVar7.x * TVar7.y * 3);
  }
  fVar14 = this->scale;
  local_70 = (optional<pbrt::LightBounds> *)CONCAT44(local_70._4_4_,(uint)this->twoSided);
  local_68 = CONCAT44(local_68._4_4_,this->area);
  uVar11 = (this->shape).
           super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
           .bits;
  sVar4 = (short)(uVar11 >> 0x30);
  if (uVar11 >> 0x32 == 0) {
    if ((0x1ffffffffffff < uVar11) && (sVar4 != 2)) {
      Disk::NormalBounds((DirectionCone *)local_88,(Disk *)(uVar11 & 0xffffffffffff));
      goto LAB_002df286;
    }
  }
  else {
    if (uVar11 >> 0x30 == 5) {
      BilinearPatch::NormalBounds
                ((DirectionCone *)local_88,(BilinearPatch *)(uVar11 & 0xffffffffffff));
      goto LAB_002df286;
    }
    if (sVar4 == 4) {
      Triangle::NormalBounds((DirectionCone *)local_88,(Triangle *)(uVar11 & 0xffffffffffff));
      goto LAB_002df286;
    }
  }
  _local_88 = vmovhps_avx(ZEXT816(0) << 0x40,0xbf8000003f800000);
  local_78 = false;
LAB_002df286:
  uVar11 = (this->shape).
           super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
           .bits;
  sVar4 = (short)(uVar11 >> 0x30);
  if (uVar11 < 0x4000000000000) {
    if (uVar11 < 0x2000000000000) {
      Sphere::Bounds(&local_60,(Sphere *)(uVar11 & 0xffffffffffff));
    }
    else if (sVar4 == 2) {
      Cylinder::Bounds(&local_60,(Cylinder *)(uVar11 & 0xffffffffffff));
    }
    else {
      Disk::Bounds(&local_60,(Disk *)(uVar11 & 0xffffffffffff));
    }
  }
  else {
    this_00 = (Curve *)(uVar11 & 0xffffffffffff);
    if (uVar11 >> 0x30 == 5) {
      BilinearPatch::Bounds(&local_60,(BilinearPatch *)this_00);
    }
    else if (sVar4 == 4) {
      Triangle::Bounds(&local_60,(Triangle *)this_00);
    }
    else {
      Curve::Bounds(&local_60,this_00);
    }
  }
  auVar5 = local_88;
  fVar3 = (float)((uint)((byte)local_70 & 1) * 0x40000000 +
                 (uint)!(bool)((byte)local_70 & 1) * 0x3f800000) * fVar14 * (float)local_68;
  FVar12 = FStack_7c;
  bVar2 = this->twoSided;
  local_48[0].x = local_60.pMin.super_Tuple3<pbrt::Point3,_float>.x;
  local_48[0].y = local_60.pMin.super_Tuple3<pbrt::Point3,_float>.y;
  local_48[0].z = local_60.pMin.super_Tuple3<pbrt::Point3,_float>.z;
  local_48[1].x = local_60.pMax.super_Tuple3<pbrt::Point3,_float>.x;
  local_48[1].y = local_60.pMax.super_Tuple3<pbrt::Point3,_float>.y;
  local_48[1].z = local_60.pMax.super_Tuple3<pbrt::Point3,_float>.z;
  auVar15._0_4_ = local_88._4_4_ * local_88._4_4_;
  auVar15._4_4_ = local_88._8_4_ * local_88._8_4_;
  auVar15._8_8_ = 0;
  auVar16 = vmovshdup_avx(auVar15);
  fVar14 = (float)local_88._0_4_ * (float)local_88._0_4_ + auVar15._0_4_ + auVar16._0_4_;
  if (fVar14 < 0.0) {
    fVar14 = sqrtf(fVar14);
  }
  else {
    auVar16 = vsqrtss_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14));
    fVar14 = auVar16._0_4_;
    local_88 = auVar5;
  }
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_88._0_8_;
  auVar17._4_4_ = fVar14;
  auVar17._0_4_ = fVar14;
  auVar17._8_4_ = fVar14;
  auVar17._12_4_ = fVar14;
  auVar16 = vdivps_avx(auVar16,auVar17);
  __return_storage_ptr__->set = true;
  *(undefined8 *)&__return_storage_ptr__->optionalValue = local_48[0]._0_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = local_48._8_8_;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = local_48[1]._4_8_;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = fVar3 * 3.1415927 * fVar13;
  uVar1 = vmovlps_avx(auVar16);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = uVar1;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x24) = (float)local_88._8_4_ / fVar14;
  *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x28) = FVar12;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x2c) = 0xb33bbd2e;
  (__return_storage_ptr__->optionalValue).__data[0x30] = bVar2;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightBounds> DiffuseAreaLight::Bounds() const {
    // Compute _phi_ for diffuse area light bounds
    Float phi = 0;
    if (image) {
        // Compute average _DiffuseAreaLight_ image channel value
        // Assume no distortion in the mapping, FWIW...
        for (int y = 0; y < image.Resolution().y; ++y)
            for (int x = 0; x < image.Resolution().x; ++x)
                for (int c = 0; c < 3; ++c)
                    phi += image.GetChannel({x, y}, c);
        phi /= 3 * image.Resolution().x * image.Resolution().y;

    } else
        phi = Lemit.MaxValue();
    phi *= scale * (twoSided ? 2 : 1) * area * Pi;

    DirectionCone nb = shape.NormalBounds();
    return LightBounds(shape.Bounds(), nb.w, phi, nb.cosTheta, std::cos(Pi / 2),
                       twoSided);
}